

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voc.c
# Opt level: O2

void vocdel1(voccxdef *ctx,objnum objn,char *wrd1,prpnum prp,int really_delete,int revert,
            int keep_undo)

{
  vocdef *pvVar1;
  vocdef *pvVar2;
  int iVar3;
  bool bVar4;
  vocdef *pvVar5;
  vocdef **ppvVar6;
  uint *puVar7;
  uint *puVar8;
  uint *puVar9;
  uint uVar10;
  uint uVar11;
  uint *puVar12;
  bool bVar13;
  byte bVar14;
  vocdef **local_90;
  char *wrd1_local;
  int local_6c;
  int local_68;
  int local_64;
  int len2;
  int len1;
  vocdef **local_58;
  vocdef **local_50;
  vocdef *local_48;
  uint *local_40;
  char *wrd2;
  
  wrd1_local = wrd1;
  local_68 = really_delete;
  local_64 = revert;
  if (wrd1 != (char *)0x0) {
    voc_parse_words(&wrd1_local,&len1,&wrd2,&len2);
  }
  local_90 = ctx->voccxhsh;
  bVar4 = keep_undo != 0 && wrd1 != (char *)0x0;
  local_6c = 0x100;
  do {
    bVar13 = local_6c == 0;
    local_6c = local_6c + -1;
    if (bVar13) {
      return;
    }
    pvVar1 = *local_90;
    pvVar2 = (vocdef *)(vocdef **)0x0;
LAB_00220b57:
    ppvVar6 = &pvVar2->vocnxt;
    pvVar5 = pvVar1;
    if (pvVar5 != (vocdef *)0x0) {
      pvVar1 = pvVar5->vocnxt;
      pvVar2 = pvVar5;
      if (wrd1_local == (char *)0x0) goto LAB_00220bd4;
      bVar14 = pvVar5->voclen;
      if (len1 == (uint)bVar14) {
        iVar3 = memicmp(pvVar5->voctxt,wrd1_local,(ulong)bVar14);
        if ((iVar3 == 0) &&
           ((wrd2 == (char *)0x0 ||
            ((len2 == (uint)pvVar5->vocln2 &&
             (iVar3 = memicmp(pvVar5->voctxt + bVar14,wrd2,(ulong)pvVar5->vocln2), iVar3 == 0))))))
        {
LAB_00220bd4:
          uVar10 = pvVar5->vocwlst;
          if (uVar10 == 0xffffffff) {
            puVar8 = (uint *)0x0;
          }
          else {
            puVar8 = (uint *)((long)&ctx->voccxwp[(ulong)uVar10 / 2000]->vocwnxt +
                             (ulong)(uVar10 % 2000 << 3));
          }
          local_50 = ppvVar6;
          if (ppvVar6 == (vocdef **)0x0) {
            local_50 = local_90;
          }
          bVar13 = false;
          puVar12 = (uint *)0x0;
          local_58 = ppvVar6;
          local_48 = pvVar1;
LAB_00220c34:
          puVar9 = puVar8;
          uVar11 = uVar10;
          puVar7 = puVar12;
          if (puVar12 == (uint *)0x0) {
            puVar7 = &pvVar5->vocwlst;
          }
LAB_00220c44:
          if (puVar9 == (uint *)0x0) {
            pvVar1 = local_48;
            pvVar2 = (vocdef *)local_58;
            if (!bVar13) {
              pvVar2 = pvVar5;
            }
            goto LAB_00220b57;
          }
          uVar10 = *puVar9;
          if (uVar10 == 0xffffffff) {
            puVar8 = (uint *)0x0;
          }
          else {
            puVar8 = (uint *)((long)&ctx->voccxwp[(ulong)uVar10 / 2000]->vocwnxt +
                             (ulong)(uVar10 % 2000 << 3));
          }
          puVar12 = puVar9;
          if (local_64 == 0) {
            if (*(objnum *)(puVar9 + 1) != objn) goto LAB_00220c34;
            bVar14 = true;
            if (wrd1_local != (char *)0x0) {
              bVar14 = *(byte *)((long)puVar9 + 6) == prp;
            }
            if ((local_68 != 0) || ((bool)bVar14 == false)) goto LAB_00220c96;
            bVar14 = *(byte *)((long)puVar9 + 7);
            if ((bVar14 & 4) == 0) {
              if (bVar4) {
                vocdusave_delwrd(ctx,objn,prp,(uint)bVar14,wrd1);
                bVar14 = *(byte *)((long)puVar9 + 7);
              }
              *(byte *)((long)puVar9 + 7) = bVar14 | 8;
              goto LAB_00220c34;
            }
          }
          else {
            bVar14 = *(byte *)((long)puVar9 + 7) & 4;
            *(byte *)((long)puVar9 + 7) = *(byte *)((long)puVar9 + 7) & 0xf7;
LAB_00220c96:
            if (bVar14 == 0) goto LAB_00220c34;
          }
          if (bVar4) {
            local_40 = puVar8;
            vocdusave_delwrd(ctx,objn,prp,(uint)*(byte *)((long)puVar9 + 7),wrd1);
            puVar8 = local_40;
          }
          *puVar7 = *puVar9;
          *puVar9 = ctx->voccxwfre;
          ctx->voccxwfre = uVar11;
          puVar9 = puVar8;
          uVar11 = uVar10;
          if (pvVar5->vocwlst == 0xffffffff) {
            *local_50 = pvVar5->vocnxt;
            pvVar5->vocnxt = ctx->voccxfre;
            ctx->voccxfre = pvVar5;
            bVar13 = true;
          }
          goto LAB_00220c44;
        }
      }
      goto LAB_00220b57;
    }
    local_90 = local_90 + 1;
  } while( true );
}

Assistant:

void vocdel1(voccxdef *ctx, objnum objn, char *wrd1, prpnum prp,
             int really_delete, int revert, int keep_undo)
{
    int       i;
    vocdef   *v;
    vocdef   *prv;
    vocdef   *nxt;
    vocdef  **vp;
    vocwdef  *vw;
    vocwdef  *prvw;
    vocwdef  *nxtw;
    uint      nxtidx;
    uint      idx;
    int       deleted_vocdef;
    char     *wrd2;
    int       len1, len2;
    int       do_del;
    char     *orgwrd;

    /* parse the word if provided */
    orgwrd = wrd1;
    if (wrd1)
        voc_parse_words(&wrd1, &len1, &wrd2, &len2);
    
    /* go through each hash value looking for matching words */
    for (i = VOCHASHSIZ, vp = ctx->voccxhsh ; i ; ++vp, --i)
    {
        /* go through all words in this hash chain */
        for (prv = (vocdef *)0, v = *vp ; v ; v = nxt)
        {
            /* remember next word in hash chain */
            nxt = v->vocnxt;

            /* if this word doesn't match, skip it */
            if (wrd1)
            {
                /* compare the first word */
                if (v->voclen != len1
                    || memicmp((char *)v->voctxt, wrd1, (size_t)len1))
                {
                    prv = v;
                    continue;
                }

                /* if there's a second word, compare it as well */
                if (wrd2 && (v->vocln2 != len2
                             || memicmp((char *)v->voctxt + len1,
                                        wrd2, (size_t)len2)))
                {
                    prv = v;
                    continue;
                }
            }

            /* presume we're not going to delete this vocdef */
            deleted_vocdef = FALSE;
            
            /* go through all object relations for this word */
            for (prvw = 0, idx = v->vocwlst, vw = vocwget(ctx, idx) ; vw ;
                 vw = nxtw, idx = nxtidx)
            {
                /* remember next word in relation list */
                nxtidx = vw->vocwnxt;
                nxtw = vocwget(ctx, nxtidx);

                /*
                 *   figure out whether to delete this word, based on the
                 *   caller's specified operating mode 
                 */
                if (revert)
                {
                    /* if reverting, delete all new words */
                    do_del = (vw->vocwflg & VOCFNEW);

                    /* also, remove the DELETED flag if present */
                    vw->vocwflg &= ~VOCFDEL;
                }
                else
                {
                    /*
                     *   delete the word if the object number matches,
                     *   AND either we're not searching for a specific
                     *   vocabulary word (in which case wrd1 will be null)
                     *   or the word matches the vocabulary word we're
                     *   seeking (in which case the part of speech must
                     *   match) 
                     */
                    do_del = (vw->vocwobj == objn
                              && (wrd1 == 0 || vw->vocwtyp == prp));

                    /*
                     *   if we're not in really_delete mode, and the word
                     *   matches and it wasn't dynamically added at
                     *   run-time, simply mark it as deleted -- this will
                     *   allow it to be undeleted if the game is reverted
                     *   to RESTART conditions 
                     */
                    if (do_del && !really_delete && !(vw->vocwflg & VOCFNEW))
                    {
                        /* geneate undo for the operation */
                        if (keep_undo && orgwrd)
                            vocdusave_delwrd(ctx, objn, prp,
                                             vw->vocwflg, orgwrd);
                        
                        /* just mark the word for deletion, but keep vw */
                        vw->vocwflg |= VOCFDEL;
                        do_del = FALSE;
                    }
                }

                /* now delete the structure if we decided we should */
                if (do_del)
                {
                    /* geneate undo for the operation */
                    if (keep_undo && orgwrd)
                        vocdusave_delwrd(ctx, objn, prp, vw->vocwflg, orgwrd);
                                         
                    /* unlink this vocwdef from the vocdef's list */
                    if (prvw)
                        prvw->vocwnxt = vw->vocwnxt;
                    else
                        v->vocwlst = vw->vocwnxt;

                    /* link the vocwdef into the vocwdef free list */
                    vw->vocwnxt = ctx->voccxwfre;
                    ctx->voccxwfre = idx;

                    /*
                     *   if there's nothing left in the vocdef's list,
                     *   delete the entire vocdef as well 
                     */
                    if (v->vocwlst == VOCCXW_NONE)
                    {
                        if (prv) prv->vocnxt = v->vocnxt;
                        else *vp = v->vocnxt;
                    
                        /* link into free chain */
                        v->vocnxt = ctx->voccxfre;
                        ctx->voccxfre = v;

                        /* note that it's been deleted */
                        deleted_vocdef = TRUE;
                    }
                }
                else
                {
                    /* we're not deleting the word, so move prvw forward */
                    prvw = vw;
                }
            }

            /* if we didn't delete this vocdef, move prv forward onto it */
            if (!deleted_vocdef)
                prv = v;
        }
    }
}